

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O2

void __thiscall std::pmr::test_resource::print(test_resource *this)

{
  size_t sVar1;
  int i;
  uint uVar2;
  Link *pLVar3;
  
  mutex::lock(&this->m_lock_);
  sVar1 = (this->m_name_)._M_len;
  if (sVar1 == 0) {
    puts(
        "\n==================================================\n                TEST RESOURCE STATE\n--------------------------------------------------"
        );
  }
  else {
    printf("\n==================================================\n                TEST RESOURCE %.*s STATE\n--------------------------------------------------\n"
           ,sVar1,(this->m_name_)._M_str);
  }
  printf("        Category\tBlocks\tBytes\n        --------\t------\t-----\n          IN USE\t%lld\t%lld\n             MAX\t%lld\t%lld\n           TOTAL\t%lld\t%lld\n      MISMATCHES\t%lld\n   BOUNDS ERRORS\t%lld\n   PARAM. ERRORS\t%lld\n--------------------------------------------------\n"
         ,(this->m_blocks_in_use_).super___atomic_base<long_long>._M_i,
         (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i,
         (this->m_max_blocks_).super___atomic_base<long_long>._M_i,
         (this->m_max_bytes_).super___atomic_base<long_long>._M_i,
         (this->m_total_blocks_).super___atomic_base<long_long>._M_i,
         (this->m_total_bytes_).super___atomic_base<unsigned_long>._M_i,
         (this->m_mismatches_).super___atomic_base<long_long>._M_i,
         (this->m_bounds_errors_).super___atomic_base<long_long>._M_i,
         (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i);
  if (this->m_list_->d_head_p != (Link *)0x0) {
    printf(" Indices of Outstanding Memory Allocations:\n ");
    pLVar3 = this->m_list_->d_head_p;
    while (pLVar3 != (Link *)0x0) {
      uVar2 = 0;
      for (; (uVar2 < 8 && (pLVar3 != (Link *)0x0)); pLVar3 = pLVar3->m_next_) {
        printf("%lld\t",pLVar3->m_index_);
        uVar2 = uVar2 + 1;
      }
      printf("\n ");
    }
  }
  fflush(_stdout);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
  return;
}

Assistant:

void test_resource::print() const noexcept
{
    lock_guard guard{ m_lock_ };

    if (!m_name_.empty()) {
        printf("\n"
               "==================================================\n"
               "                TEST RESOURCE %.*s STATE\n"
               "--------------------------------------------------\n",
               static_cast<int>(m_name_.length()), m_name_.data());
    }
    else {
        printf("\n"
               "==================================================\n"
               "                TEST RESOURCE STATE\n"
               "--------------------------------------------------\n");
    }

    printf("        Category\tBlocks\tBytes\n"
           "        --------\t------\t-----\n"
           "          IN USE\t%lld\t%lld\n"
           "             MAX\t%lld\t%lld\n"
           "           TOTAL\t%lld\t%lld\n"
           "      MISMATCHES\t%lld\n"
           "   BOUNDS ERRORS\t%lld\n"
           "   PARAM. ERRORS\t%lld\n"
           "--------------------------------------------------\n",
           blocks_in_use(), bytes_in_use(),
           max_blocks(),    max_bytes(),
           total_blocks(),  total_bytes(),
           mismatches(),    bounds_errors(),
           bad_deallocate_params());

    if (m_list_->d_head_p) {
        printf(" Indices of Outstanding Memory Allocations:\n ");
        printList(*m_list_);
    }
    std::fflush(stdout);
}